

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O2

void xmlNanoFTPInit(void)

{
  char *pcVar1;
  
  if (initialized == '\0') {
    proxyPort = 0x15;
    pcVar1 = getenv("no_proxy");
    if (((pcVar1 == (char *)0x0) || (*pcVar1 != '*')) || (pcVar1[1] != '\0')) {
      pcVar1 = getenv("ftp_proxy");
      if ((pcVar1 != (char *)0x0) || (pcVar1 = getenv("FTP_PROXY"), pcVar1 != (char *)0x0)) {
        xmlNanoFTPScanProxy(pcVar1);
      }
      pcVar1 = getenv("ftp_proxy_user");
      if (pcVar1 != (char *)0x0) {
        proxyUser = (*xmlMemStrdup)(pcVar1);
      }
      pcVar1 = getenv("ftp_proxy_password");
      if (pcVar1 != (char *)0x0) {
        proxyPasswd = (*xmlMemStrdup)(pcVar1);
      }
      initialized = '\x01';
    }
  }
  return;
}

Assistant:

void
xmlNanoFTPInit(void) {
    const char *env;
#ifdef _WINSOCKAPI_
    WSADATA wsaData;
#endif

    if (initialized)
	return;

#ifdef _WINSOCKAPI_
    if (WSAStartup(MAKEWORD(1, 1), &wsaData) != 0)
	return;
#endif

    proxyPort = 21;
    env = getenv("no_proxy");
    if (env && ((env[0] == '*' ) && (env[1] == 0)))
	return;
    env = getenv("ftp_proxy");
    if (env != NULL) {
	xmlNanoFTPScanProxy(env);
    } else {
	env = getenv("FTP_PROXY");
	if (env != NULL) {
	    xmlNanoFTPScanProxy(env);
	}
    }
    env = getenv("ftp_proxy_user");
    if (env != NULL) {
	proxyUser = xmlMemStrdup(env);
    }
    env = getenv("ftp_proxy_password");
    if (env != NULL) {
	proxyPasswd = xmlMemStrdup(env);
    }
    initialized = 1;
}